

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O2

void absl::StrAppend(string *dest,AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d)

{
  pointer __dest;
  pointer pcVar1;
  size_t sVar2;
  size_t __n;
  ulong uVar3;
  pointer pcVar4;
  
  if (((a->piece_).length_ != 0) &&
     ((ulong)((long)(a->piece_).ptr_ - (long)(dest->_M_dataplus)._M_p) <= dest->_M_string_length)) {
    __assert_fail("((a).size() == 0) || (uintptr_t((a).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                  ,0xe0,
                  "void absl::StrAppend(string *, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  if (((b->piece_).length_ != 0) &&
     ((ulong)((long)(b->piece_).ptr_ - (long)(dest->_M_dataplus)._M_p) <= dest->_M_string_length)) {
    __assert_fail("((b).size() == 0) || (uintptr_t((b).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                  ,0xe1,
                  "void absl::StrAppend(string *, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  if (((c->piece_).length_ != 0) &&
     ((ulong)((long)(c->piece_).ptr_ - (long)(dest->_M_dataplus)._M_p) <= dest->_M_string_length)) {
    __assert_fail("((c).size() == 0) || (uintptr_t((c).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                  ,0xe2,
                  "void absl::StrAppend(string *, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  if ((d->piece_).length_ == 0) {
    uVar3 = dest->_M_string_length;
  }
  else {
    uVar3 = dest->_M_string_length;
    if ((ulong)((long)(d->piece_).ptr_ - (long)(dest->_M_dataplus)._M_p) <= uVar3) {
      __assert_fail("((d).size() == 0) || (uintptr_t((d).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                    ,0xe3,
                    "void absl::StrAppend(string *, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                   );
    }
  }
  std::__cxx11::string::resize((ulong)dest);
  pcVar1 = (dest->_M_dataplus)._M_p;
  pcVar4 = pcVar1 + uVar3;
  sVar2 = (a->piece_).length_;
  __dest = pcVar4 + sVar2;
  memcpy(pcVar4,(a->piece_).ptr_,sVar2);
  sVar2 = (b->piece_).length_;
  pcVar4 = __dest + sVar2;
  memcpy(__dest,(b->piece_).ptr_,sVar2);
  sVar2 = (c->piece_).length_;
  memcpy(pcVar4,(c->piece_).ptr_,sVar2);
  __n = (d->piece_).length_;
  memcpy(pcVar4 + sVar2,(d->piece_).ptr_,__n);
  if (pcVar4 + sVar2 + __n == pcVar1 + dest->_M_string_length) {
    return;
  }
  __assert_fail("out == begin + dest->size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                ,0xed,
                "void absl::StrAppend(string *, const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
               );
}

Assistant:

void StrAppend(string* dest, const AlphaNum& a, const AlphaNum& b,
               const AlphaNum& c, const AlphaNum& d) {
  ASSERT_NO_OVERLAP(*dest, a);
  ASSERT_NO_OVERLAP(*dest, b);
  ASSERT_NO_OVERLAP(*dest, c);
  ASSERT_NO_OVERLAP(*dest, d);
  string::size_type old_size = dest->size();
  strings_internal::STLStringResizeUninitialized(
      dest, old_size + a.size() + b.size() + c.size() + d.size());
  char* const begin = &*dest->begin();
  char* out = begin + old_size;
  out = Append(out, a);
  out = Append(out, b);
  out = Append(out, c);
  out = Append(out, d);
  assert(out == begin + dest->size());
}